

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testMultiPartThreading.cpp
# Opt level: O3

void __thiscall anon_unknown.dwarf_24b2a5::WritingTask::execute(WritingTask *this)

{
  Imf_3_2::TiledOutputPart::writeTiles
            ((int)this->part,0,this->numXTiles + -1,this->startY,this->startY,this->lx);
  return;
}

Assistant:

void execute ()
    {
        for (size_t i = 0; i < data.size (); i++)
        {
            int partNumber = data[i]->partNumber;
            int partType   = partTypes[partNumber];

            if (partType == 0)
            {
                OutputPart part (*file, partNumber);
                part.writePixels ();
            }
            else
            {
                int             tx = data[i]->tx;
                int             ty = data[i]->ty;
                int             lx = data[i]->lx;
                int             ly = data[i]->ly;
                TiledOutputPart part (*file, partNumber);

                //
                // We add lock here to assure that two threads that accessing
                // the same part won't mess things up.
                //

                std::lock_guard<std::mutex> lock (mutexes[partNumber]);

                part.setFrameBuffer (tiledFrameBuffers[partNumber][ly][lx]);
                part.writeTile (tx, ty, lx, ly);
            }
        }
    }